

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

TCGArg do_constant_folding_cond(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y,TCGCond c)

{
  byte *pbVar1;
  uint64_t y_00;
  uint64_t x_00;
  _Bool _Var2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  pbVar1 = *(byte **)(y + 0x30);
  y_00 = *(uint64_t *)(pbVar1 + 0x18);
  if ((**(char **)(x + 0x30) == '\x01') && (*pbVar1 == 1)) {
    x_00 = *(uint64_t *)(*(char **)(x + 0x30) + 0x18);
    if ((s->tcg_op_defs[op].flags & 0x10) == 0) {
      uVar4 = (uint)x_00;
      uVar5 = (uint)y_00;
      switch(c) {
      case TCG_COND_LT:
        bVar3 = (int)uVar4 < (int)uVar5;
        break;
      case TCG_COND_GE:
        bVar3 = (int)uVar5 <= (int)uVar4;
        break;
      case TCG_COND_LTU:
        bVar3 = uVar4 < uVar5;
        break;
      case TCG_COND_GEU:
        bVar3 = uVar5 <= uVar4;
        break;
      default:
        fprintf(_stderr,"%s:%d: tcg fatal error\n",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
                ,0x1c3);
        abort();
      case TCG_COND_EQ:
        bVar3 = uVar4 == uVar5;
        break;
      case TCG_COND_NE:
        bVar3 = uVar4 != uVar5;
        break;
      case TCG_COND_LE:
        bVar3 = (int)uVar4 <= (int)uVar5;
        break;
      case TCG_COND_GT:
        bVar3 = (int)uVar5 < (int)uVar4;
        break;
      case TCG_COND_LEU:
        bVar3 = uVar4 <= uVar5;
        break;
      case TCG_COND_GTU:
        bVar3 = uVar5 < uVar4;
      }
    }
    else {
      bVar3 = do_constant_folding_cond_64(x_00,y_00,c);
    }
  }
  else {
    _Var2 = ts_are_copies((TCGTemp *)x,(TCGTemp *)y);
    if (!_Var2) {
      if ((y_00 == 0 & *pbVar1) != 1) {
        return 2;
      }
      if (c == TCG_COND_LTU) {
        return 0;
      }
      return (ulong)(c != TCG_COND_GEU) + 1;
    }
    bVar3 = do_constant_folding_cond_eq(c);
  }
  return (ulong)bVar3;
}

Assistant:

static TCGArg do_constant_folding_cond(TCGContext *s, TCGOpcode op, TCGArg x,
                                       TCGArg y, TCGCond c)
{
    tcg_target_ulong xv = arg_info(x)->val;
    tcg_target_ulong yv = arg_info(y)->val;
    if (arg_is_const(x) && arg_is_const(y)) {
        const TCGOpDef *def = &s->tcg_op_defs[op];
        tcg_debug_assert(!(def->flags & TCG_OPF_VECTOR));
        if (def->flags & TCG_OPF_64BIT) {
            return do_constant_folding_cond_64(xv, yv, c);
        } else {
            return do_constant_folding_cond_32(xv, yv, c);
        }
    } else if (args_are_copies(x, y)) {
        return do_constant_folding_cond_eq(c);
    } else if (arg_is_const(y) && yv == 0) {
        switch (c) {
        case TCG_COND_LTU:
            return 0;
        case TCG_COND_GEU:
            return 1;
        default:
            return 2;
        }
    }
    return 2;
}